

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::TcpSocketEngine::WaitForRead(TcpSocketEngine *this,int msec,bool *timedOut)

{
  int iVar1;
  
  *timedOut = false;
  iVar1 = nativeSelect(this,msec,true);
  if (iVar1 == 0) {
    *timedOut = true;
    this->m_socketError = SocketTimeoutError;
    std::__cxx11::string::assign((char *)&this->m_errorString);
  }
  return 0 < iVar1;
}

Assistant:

bool TcpSocketEngine::WaitForRead(int msec, bool* timedOut) {

    // reset timedOut flag
    *timedOut = false;

    // need to wait for our socket to be ready to read
    const int ret = nativeSelect(msec, true);

    // if timed out
    if ( ret == 0 ) {
        *timedOut = true;
        m_socketError = TcpSocket::SocketTimeoutError;
        m_errorString = "socket timed out";
    }

    // return if any sockets available for reading
    return ( ret > 0 );
}